

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [12];
  char cVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong *puVar34;
  ulong *puVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar40 [32];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  undefined1 auVar46 [32];
  undefined1 auVar52 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [32];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar63 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar78;
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 in_ZMM10 [64];
  float fVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_ZMM11 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  NodeRef stack [564];
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  size_t local_11d8;
  ulong local_11d0 [564];
  undefined1 auVar59 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar98._4_4_ = fVar1;
  auVar98._0_4_ = fVar1;
  auVar98._8_4_ = fVar1;
  auVar98._12_4_ = fVar1;
  auVar98._16_4_ = fVar1;
  auVar98._20_4_ = fVar1;
  auVar98._24_4_ = fVar1;
  auVar98._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar61._4_4_ = fVar2;
  auVar61._0_4_ = fVar2;
  auVar61._8_4_ = fVar2;
  auVar61._12_4_ = fVar2;
  auVar61._16_4_ = fVar2;
  auVar61._20_4_ = fVar2;
  auVar61._24_4_ = fVar2;
  auVar61._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar96._4_4_ = fVar3;
  auVar96._0_4_ = fVar3;
  auVar96._8_4_ = fVar3;
  auVar96._12_4_ = fVar3;
  auVar96._16_4_ = fVar3;
  auVar96._20_4_ = fVar3;
  auVar96._24_4_ = fVar3;
  auVar96._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  fVar10 = *(float *)((long)&(tray->tnear).field_0 + k * 4);
  auVar67._4_4_ = fVar10;
  auVar67._0_4_ = fVar10;
  auVar67._8_4_ = fVar10;
  auVar67._12_4_ = fVar10;
  auVar67._16_4_ = fVar10;
  auVar67._20_4_ = fVar10;
  auVar67._24_4_ = fVar10;
  auVar67._28_4_ = fVar10;
  fVar11 = *(float *)((long)&(tray->tfar).field_0 + k * 4);
  auVar70._4_4_ = fVar11;
  auVar70._0_4_ = fVar11;
  auVar70._8_4_ = fVar11;
  auVar70._12_4_ = fVar11;
  auVar70._16_4_ = fVar11;
  auVar70._20_4_ = fVar11;
  auVar70._24_4_ = fVar11;
  auVar70._28_4_ = fVar11;
  puVar35 = local_11d0;
LAB_0107aa34:
  puVar34 = puVar35;
  if (puVar34 == &local_11d8) {
LAB_0107aee8:
    return puVar34 != &local_11d8;
  }
  puVar35 = puVar34 + -1;
  uVar36 = puVar34[-1];
LAB_0107aa48:
  if ((uVar36 & 0xf) == 0) {
    auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar32),auVar98);
    auVar17._4_4_ = fVar7 * auVar88._4_4_;
    auVar17._0_4_ = fVar7 * auVar88._0_4_;
    auVar17._8_4_ = fVar7 * auVar88._8_4_;
    auVar17._12_4_ = fVar7 * auVar88._12_4_;
    auVar17._16_4_ = fVar7 * auVar88._16_4_;
    auVar17._20_4_ = fVar7 * auVar88._20_4_;
    auVar17._24_4_ = fVar7 * auVar88._24_4_;
    auVar17._28_4_ = auVar88._28_4_;
    auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar61);
    auVar18._4_4_ = fVar8 * auVar88._4_4_;
    auVar18._0_4_ = fVar8 * auVar88._0_4_;
    auVar18._8_4_ = fVar8 * auVar88._8_4_;
    auVar18._12_4_ = fVar8 * auVar88._12_4_;
    auVar18._16_4_ = fVar8 * auVar88._16_4_;
    auVar18._20_4_ = fVar8 * auVar88._20_4_;
    auVar18._24_4_ = fVar8 * auVar88._24_4_;
    auVar18._28_4_ = auVar88._28_4_;
    auVar88 = vmaxps_avx(auVar17,auVar18);
    auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar33),auVar96);
    auVar19._4_4_ = fVar9 * auVar40._4_4_;
    auVar19._0_4_ = fVar9 * auVar40._0_4_;
    auVar19._8_4_ = fVar9 * auVar40._8_4_;
    auVar19._12_4_ = fVar9 * auVar40._12_4_;
    auVar19._16_4_ = fVar9 * auVar40._16_4_;
    auVar19._20_4_ = fVar9 * auVar40._20_4_;
    auVar19._24_4_ = fVar9 * auVar40._24_4_;
    auVar19._28_4_ = auVar40._28_4_;
    auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar32 ^ 0x20)),auVar98);
    auVar20._4_4_ = fVar7 * auVar40._4_4_;
    auVar20._0_4_ = fVar7 * auVar40._0_4_;
    auVar20._8_4_ = fVar7 * auVar40._8_4_;
    auVar20._12_4_ = fVar7 * auVar40._12_4_;
    auVar20._16_4_ = fVar7 * auVar40._16_4_;
    auVar20._20_4_ = fVar7 * auVar40._20_4_;
    auVar20._24_4_ = fVar7 * auVar40._24_4_;
    auVar20._28_4_ = auVar40._28_4_;
    auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar37 ^ 0x20)),auVar61);
    auVar21._4_4_ = fVar8 * auVar40._4_4_;
    auVar21._0_4_ = fVar8 * auVar40._0_4_;
    auVar21._8_4_ = fVar8 * auVar40._8_4_;
    auVar21._12_4_ = fVar8 * auVar40._12_4_;
    auVar21._16_4_ = fVar8 * auVar40._16_4_;
    auVar21._20_4_ = fVar8 * auVar40._20_4_;
    auVar21._24_4_ = fVar8 * auVar40._24_4_;
    auVar21._28_4_ = auVar40._28_4_;
    auVar46 = vminps_avx(auVar20,auVar21);
    auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar33 ^ 0x20)),auVar96);
    auVar22._4_4_ = fVar9 * auVar40._4_4_;
    auVar22._0_4_ = fVar9 * auVar40._0_4_;
    auVar22._8_4_ = fVar9 * auVar40._8_4_;
    auVar22._12_4_ = fVar9 * auVar40._12_4_;
    auVar22._16_4_ = fVar9 * auVar40._16_4_;
    auVar22._20_4_ = fVar9 * auVar40._20_4_;
    auVar22._24_4_ = fVar9 * auVar40._24_4_;
    auVar22._28_4_ = auVar40._28_4_;
    auVar40 = vmaxps_avx(auVar19,auVar67);
    auVar88 = vmaxps_avx(auVar88,auVar40);
    auVar40 = vminps_avx(auVar22,auVar70);
    auVar40 = vminps_avx(auVar46,auVar40);
    auVar88 = vcmpps_avx(auVar88,auVar40,2);
    auVar13 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
  }
  else {
    if ((int)(uVar36 & 0xf) != 2) {
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      cVar28 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar36 & 0xfffffffffffffff0) * 0x40 + 0x28))
                         (pre,ray,k,context);
      if (cVar28 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        goto LAB_0107aee8;
      }
      goto LAB_0107aa34;
    }
    uVar29 = uVar36 & 0xfffffffffffffff0;
    auVar27 = *(undefined1 (*) [12])(uVar29 + 0x80);
    fVar41 = *(float *)(uVar29 + 0xbc);
    auVar79._0_4_ =
         fVar5 * *(float *)(uVar29 + 0xa0) + fVar6 * *(float *)(uVar29 + 0x100) +
         fVar4 * *(float *)(uVar29 + 0x40);
    auVar79._4_4_ =
         fVar5 * *(float *)(uVar29 + 0xa4) + fVar6 * *(float *)(uVar29 + 0x104) +
         fVar4 * *(float *)(uVar29 + 0x44);
    auVar79._8_4_ =
         fVar5 * *(float *)(uVar29 + 0xa8) + fVar6 * *(float *)(uVar29 + 0x108) +
         fVar4 * *(float *)(uVar29 + 0x48);
    auVar79._12_4_ =
         fVar5 * *(float *)(uVar29 + 0xac) + fVar6 * *(float *)(uVar29 + 0x10c) +
         fVar4 * *(float *)(uVar29 + 0x4c);
    auVar79._16_4_ =
         fVar5 * *(float *)(uVar29 + 0xb0) + fVar6 * *(float *)(uVar29 + 0x110) +
         fVar4 * *(float *)(uVar29 + 0x50);
    auVar79._20_4_ =
         fVar5 * *(float *)(uVar29 + 0xb4) + fVar6 * *(float *)(uVar29 + 0x114) +
         fVar4 * *(float *)(uVar29 + 0x54);
    auVar79._24_4_ =
         fVar5 * *(float *)(uVar29 + 0xb8) + fVar6 * *(float *)(uVar29 + 0x118) +
         fVar4 * *(float *)(uVar29 + 0x58);
    auVar79._28_4_ = in_ZMM10._28_4_ + fVar9 + fVar5;
    auVar87._0_4_ =
         fVar6 * *(float *)(uVar29 + 0x120) + fVar5 * *(float *)(uVar29 + 0xc0) +
         fVar4 * *(float *)(uVar29 + 0x60);
    auVar87._4_4_ =
         fVar6 * *(float *)(uVar29 + 0x124) + fVar5 * *(float *)(uVar29 + 0xc4) +
         fVar4 * *(float *)(uVar29 + 100);
    auVar87._8_4_ =
         fVar6 * *(float *)(uVar29 + 0x128) + fVar5 * *(float *)(uVar29 + 200) +
         fVar4 * *(float *)(uVar29 + 0x68);
    auVar87._12_4_ =
         fVar6 * *(float *)(uVar29 + 300) + fVar5 * *(float *)(uVar29 + 0xcc) +
         fVar4 * *(float *)(uVar29 + 0x6c);
    auVar87._16_4_ =
         fVar6 * *(float *)(uVar29 + 0x130) + fVar5 * *(float *)(uVar29 + 0xd0) +
         fVar4 * *(float *)(uVar29 + 0x70);
    auVar87._20_4_ =
         fVar6 * *(float *)(uVar29 + 0x134) + fVar5 * *(float *)(uVar29 + 0xd4) +
         fVar4 * *(float *)(uVar29 + 0x74);
    auVar87._24_4_ =
         fVar6 * *(float *)(uVar29 + 0x138) + fVar5 * *(float *)(uVar29 + 0xd8) +
         fVar4 * *(float *)(uVar29 + 0x78);
    auVar87._28_4_ = fVar10 + in_ZMM11._28_4_ + fVar5;
    auVar71._0_4_ =
         fVar6 * *(float *)(uVar29 + 0x140) + fVar5 * *(float *)(uVar29 + 0xe0) +
         *(float *)*(undefined1 (*) [12])(uVar29 + 0x80) * fVar4;
    auVar71._4_4_ =
         fVar6 * *(float *)(uVar29 + 0x144) + fVar5 * *(float *)(uVar29 + 0xe4) +
         *(float *)(uVar29 + 0x84) * fVar4;
    auVar71._8_4_ =
         fVar6 * *(float *)(uVar29 + 0x148) + fVar5 * *(float *)(uVar29 + 0xe8) +
         *(float *)(uVar29 + 0x88) * fVar4;
    auVar71._12_4_ =
         fVar6 * *(float *)(uVar29 + 0x14c) + fVar5 * *(float *)(uVar29 + 0xec) +
         *(float *)(uVar29 + 0x8c) * fVar4;
    auVar71._16_4_ =
         fVar6 * *(float *)(uVar29 + 0x150) + fVar5 * *(float *)(uVar29 + 0xf0) +
         *(float *)(uVar29 + 0x90) * fVar4;
    auVar71._20_4_ =
         fVar6 * *(float *)(uVar29 + 0x154) + fVar5 * *(float *)(uVar29 + 0xf4) +
         *(float *)(uVar29 + 0x94) * fVar4;
    auVar71._24_4_ =
         fVar6 * *(float *)(uVar29 + 0x158) + fVar5 * *(float *)(uVar29 + 0xf8) +
         *(float *)(uVar29 + 0x98) * fVar4;
    auVar71._28_4_ = fVar11 + fVar5 + fVar5;
    auVar65._8_4_ = 0x7fffffff;
    auVar65._0_8_ = 0x7fffffff7fffffff;
    auVar65._12_4_ = 0x7fffffff;
    auVar65._16_4_ = 0x7fffffff;
    auVar65._20_4_ = 0x7fffffff;
    auVar65._24_4_ = 0x7fffffff;
    auVar65._28_4_ = 0x7fffffff;
    auVar88 = vandps_avx(auVar79,auVar65);
    auVar95._8_4_ = 0x219392ef;
    auVar95._0_8_ = 0x219392ef219392ef;
    auVar95._12_4_ = 0x219392ef;
    auVar95._16_4_ = 0x219392ef;
    auVar95._20_4_ = 0x219392ef;
    auVar95._24_4_ = 0x219392ef;
    auVar95._28_4_ = 0x219392ef;
    auVar88 = vcmpps_avx(auVar88,auVar95,1);
    auVar40 = vblendvps_avx(auVar79,auVar95,auVar88);
    auVar88 = vandps_avx(auVar87,auVar65);
    auVar88 = vcmpps_avx(auVar88,auVar95,1);
    auVar46 = vblendvps_avx(auVar87,auVar95,auVar88);
    auVar88 = vandps_avx(auVar71,auVar65);
    auVar88 = vcmpps_avx(auVar88,auVar95,1);
    auVar88 = vblendvps_avx(auVar71,auVar95,auVar88);
    auVar53 = vrcpps_avx(auVar40);
    fVar69 = auVar53._0_4_;
    fVar72 = auVar53._4_4_;
    auVar14._4_4_ = fVar72 * auVar40._4_4_;
    auVar14._0_4_ = fVar69 * auVar40._0_4_;
    fVar73 = auVar53._8_4_;
    auVar14._8_4_ = fVar73 * auVar40._8_4_;
    fVar74 = auVar53._12_4_;
    auVar14._12_4_ = fVar74 * auVar40._12_4_;
    fVar75 = auVar53._16_4_;
    auVar14._16_4_ = fVar75 * auVar40._16_4_;
    fVar76 = auVar53._20_4_;
    auVar14._20_4_ = fVar76 * auVar40._20_4_;
    fVar77 = auVar53._24_4_;
    auVar14._24_4_ = fVar77 * auVar40._24_4_;
    auVar14._28_4_ = auVar40._28_4_;
    auVar66._8_4_ = 0x3f800000;
    auVar66._0_8_ = 0x3f8000003f800000;
    auVar66._12_4_ = 0x3f800000;
    auVar66._16_4_ = 0x3f800000;
    auVar66._20_4_ = 0x3f800000;
    auVar66._24_4_ = 0x3f800000;
    auVar66._28_4_ = 0x3f800000;
    auVar14 = vsubps_avx(auVar66,auVar14);
    auVar40 = vrcpps_avx(auVar46);
    fVar69 = fVar69 + fVar69 * auVar14._0_4_;
    fVar72 = fVar72 + fVar72 * auVar14._4_4_;
    fVar73 = fVar73 + fVar73 * auVar14._8_4_;
    fVar74 = fVar74 + fVar74 * auVar14._12_4_;
    fVar75 = fVar75 + fVar75 * auVar14._16_4_;
    fVar76 = fVar76 + fVar76 * auVar14._20_4_;
    fVar77 = fVar77 + fVar77 * auVar14._24_4_;
    fVar78 = auVar40._0_4_;
    fVar80 = auVar40._4_4_;
    auVar15._4_4_ = fVar80 * auVar46._4_4_;
    auVar15._0_4_ = fVar78 * auVar46._0_4_;
    fVar81 = auVar40._8_4_;
    auVar15._8_4_ = fVar81 * auVar46._8_4_;
    fVar82 = auVar40._12_4_;
    auVar15._12_4_ = fVar82 * auVar46._12_4_;
    fVar83 = auVar40._16_4_;
    auVar15._16_4_ = fVar83 * auVar46._16_4_;
    fVar84 = auVar40._20_4_;
    auVar15._20_4_ = fVar84 * auVar46._20_4_;
    fVar85 = auVar40._24_4_;
    auVar15._24_4_ = fVar85 * auVar46._24_4_;
    auVar15._28_4_ = auVar14._28_4_;
    auVar15 = vsubps_avx(auVar66,auVar15);
    auVar46 = vrcpps_avx(auVar88);
    fVar78 = fVar78 + fVar78 * auVar15._0_4_;
    fVar80 = fVar80 + fVar80 * auVar15._4_4_;
    fVar81 = fVar81 + fVar81 * auVar15._8_4_;
    fVar82 = fVar82 + fVar82 * auVar15._12_4_;
    fVar83 = fVar83 + fVar83 * auVar15._16_4_;
    fVar84 = fVar84 + fVar84 * auVar15._20_4_;
    fVar85 = fVar85 + fVar85 * auVar15._24_4_;
    fVar86 = auVar46._0_4_;
    fVar89 = auVar46._4_4_;
    auVar23._4_4_ = fVar89 * auVar88._4_4_;
    auVar23._0_4_ = fVar86 * auVar88._0_4_;
    fVar90 = auVar46._8_4_;
    auVar23._8_4_ = fVar90 * auVar88._8_4_;
    fVar91 = auVar46._12_4_;
    auVar23._12_4_ = fVar91 * auVar88._12_4_;
    fVar92 = auVar46._16_4_;
    auVar23._16_4_ = fVar92 * auVar88._16_4_;
    fVar93 = auVar46._20_4_;
    auVar23._20_4_ = fVar93 * auVar88._20_4_;
    fVar94 = auVar46._24_4_;
    auVar23._24_4_ = fVar94 * auVar88._24_4_;
    auVar23._28_4_ = auVar88._28_4_;
    auVar88 = vsubps_avx(auVar66,auVar23);
    fVar86 = fVar86 + fVar86 * auVar88._0_4_;
    fVar89 = fVar89 + fVar89 * auVar88._4_4_;
    fVar90 = fVar90 + fVar90 * auVar88._8_4_;
    fVar91 = fVar91 + fVar91 * auVar88._12_4_;
    fVar92 = fVar92 + fVar92 * auVar88._16_4_;
    fVar93 = fVar93 + fVar93 * auVar88._20_4_;
    fVar94 = fVar94 + fVar94 * auVar88._24_4_;
    fVar57 = *(float *)(uVar29 + 0x5c) +
             fVar41 + *(float *)(uVar29 + 0x11c) + *(float *)(uVar29 + 0x17c);
    auVar52._0_4_ =
         -fVar69 * (fVar1 * *(float *)(uVar29 + 0x40) +
                   fVar2 * *(float *)(uVar29 + 0xa0) +
                   fVar3 * *(float *)(uVar29 + 0x100) + *(float *)(uVar29 + 0x160));
    auVar52._4_4_ =
         -fVar72 * (fVar1 * *(float *)(uVar29 + 0x44) +
                   fVar2 * *(float *)(uVar29 + 0xa4) +
                   fVar3 * *(float *)(uVar29 + 0x104) + *(float *)(uVar29 + 0x164));
    auVar52._8_4_ =
         -fVar73 * (fVar1 * *(float *)(uVar29 + 0x48) +
                   fVar2 * *(float *)(uVar29 + 0xa8) +
                   fVar3 * *(float *)(uVar29 + 0x108) + *(float *)(uVar29 + 0x168));
    auVar52._12_4_ =
         -fVar74 * (fVar1 * *(float *)(uVar29 + 0x4c) +
                   fVar2 * *(float *)(uVar29 + 0xac) +
                   fVar3 * *(float *)(uVar29 + 0x10c) + *(float *)(uVar29 + 0x16c));
    fVar54 = -fVar75 * (fVar1 * *(float *)(uVar29 + 0x50) +
                       fVar2 * *(float *)(uVar29 + 0xb0) +
                       fVar3 * *(float *)(uVar29 + 0x110) + *(float *)(uVar29 + 0x170));
    auVar24._16_4_ = fVar54;
    auVar24._0_16_ = auVar52;
    fVar55 = -fVar76 * (fVar1 * *(float *)(uVar29 + 0x54) +
                       fVar2 * *(float *)(uVar29 + 0xb4) +
                       fVar3 * *(float *)(uVar29 + 0x114) + *(float *)(uVar29 + 0x174));
    auVar24._20_4_ = fVar55;
    fVar56 = -fVar77 * (fVar1 * *(float *)(uVar29 + 0x58) +
                       fVar2 * *(float *)(uVar29 + 0xb8) +
                       fVar3 * *(float *)(uVar29 + 0x118) + *(float *)(uVar29 + 0x178));
    auVar24._24_4_ = fVar56;
    auVar24._28_4_ = fVar57;
    fVar51 = *(float *)(uVar29 + 0x7c) +
             fVar41 + *(float *)(uVar29 + 0x13c) + *(float *)(uVar29 + 0x19c);
    auVar45._0_4_ =
         -fVar78 * (fVar1 * *(float *)(uVar29 + 0x60) +
                   fVar2 * *(float *)(uVar29 + 0xc0) +
                   fVar3 * *(float *)(uVar29 + 0x120) + *(float *)(uVar29 + 0x180));
    auVar45._4_4_ =
         -fVar80 * (fVar1 * *(float *)(uVar29 + 100) +
                   fVar2 * *(float *)(uVar29 + 0xc4) +
                   fVar3 * *(float *)(uVar29 + 0x124) + *(float *)(uVar29 + 0x184));
    auVar45._8_4_ =
         -fVar81 * (fVar1 * *(float *)(uVar29 + 0x68) +
                   fVar2 * *(float *)(uVar29 + 200) +
                   fVar3 * *(float *)(uVar29 + 0x128) + *(float *)(uVar29 + 0x188));
    auVar45._12_4_ =
         -fVar82 * (fVar1 * *(float *)(uVar29 + 0x6c) +
                   fVar2 * *(float *)(uVar29 + 0xcc) +
                   fVar3 * *(float *)(uVar29 + 300) + *(float *)(uVar29 + 0x18c));
    fVar47 = -fVar83 * (fVar1 * *(float *)(uVar29 + 0x70) +
                       fVar2 * *(float *)(uVar29 + 0xd0) +
                       fVar3 * *(float *)(uVar29 + 0x130) + *(float *)(uVar29 + 400));
    auVar25._16_4_ = fVar47;
    auVar25._0_16_ = auVar45;
    fVar49 = -fVar84 * (fVar1 * *(float *)(uVar29 + 0x74) +
                       fVar2 * *(float *)(uVar29 + 0xd4) +
                       fVar3 * *(float *)(uVar29 + 0x134) + *(float *)(uVar29 + 0x194));
    auVar25._20_4_ = fVar49;
    fVar50 = -fVar85 * (fVar1 * *(float *)(uVar29 + 0x78) +
                       fVar2 * *(float *)(uVar29 + 0xd8) +
                       fVar3 * *(float *)(uVar29 + 0x138) + *(float *)(uVar29 + 0x198));
    auVar25._24_4_ = fVar50;
    auVar25._28_4_ = fVar51;
    local_1358 = auVar27._0_4_;
    fStack_1354 = auVar27._4_4_;
    fStack_1350 = auVar27._8_4_;
    fVar44 = *(float *)(uVar29 + 0xdc) +
             fVar41 + *(float *)(uVar29 + 0x15c) + *(float *)(uVar29 + 0x1bc);
    auVar39._0_4_ =
         -fVar86 * (fVar1 * local_1358 +
                   *(float *)(uVar29 + 0xe0) * fVar2 +
                   fVar3 * *(float *)(uVar29 + 0x140) + *(float *)(uVar29 + 0x1a0));
    auVar39._4_4_ =
         -fVar89 * (fVar1 * fStack_1354 +
                   *(float *)(uVar29 + 0xe4) * fVar2 +
                   fVar3 * *(float *)(uVar29 + 0x144) + *(float *)(uVar29 + 0x1a4));
    auVar39._8_4_ =
         -fVar90 * (fVar1 * fStack_1350 +
                   *(float *)(uVar29 + 0xe8) * fVar2 +
                   fVar3 * *(float *)(uVar29 + 0x148) + *(float *)(uVar29 + 0x1a8));
    auVar39._12_4_ =
         -fVar91 * (fVar1 * *(float *)(uVar29 + 0x8c) +
                   *(float *)(uVar29 + 0xec) * fVar2 +
                   fVar3 * *(float *)(uVar29 + 0x14c) + *(float *)(uVar29 + 0x1ac));
    fVar41 = -fVar92 * (fVar1 * *(float *)(uVar29 + 0x90) +
                       *(float *)(uVar29 + 0xf0) * fVar2 +
                       fVar3 * *(float *)(uVar29 + 0x150) + *(float *)(uVar29 + 0x1b0));
    auVar26._16_4_ = fVar41;
    auVar26._0_16_ = auVar39;
    fVar42 = -fVar93 * (fVar1 * *(float *)(uVar29 + 0x94) +
                       *(float *)(uVar29 + 0xf4) * fVar2 +
                       fVar3 * *(float *)(uVar29 + 0x154) + *(float *)(uVar29 + 0x1b4));
    auVar26._20_4_ = fVar42;
    fVar43 = -fVar94 * (fVar1 * *(float *)(uVar29 + 0x98) +
                       *(float *)(uVar29 + 0xf8) * fVar2 +
                       fVar3 * *(float *)(uVar29 + 0x158) + *(float *)(uVar29 + 0x1b8));
    auVar26._24_4_ = fVar43;
    auVar26._28_4_ = fVar44;
    auVar60._0_4_ = fVar69 + auVar52._0_4_;
    auVar60._4_4_ = fVar72 + auVar52._4_4_;
    auVar60._8_4_ = fVar73 + auVar52._8_4_;
    auVar60._12_4_ = fVar74 + auVar52._12_4_;
    auVar62._16_4_ = fVar75 + fVar54;
    auVar62._0_16_ = auVar60;
    auVar62._20_4_ = fVar76 + fVar55;
    auVar62._24_4_ = fVar77 + fVar56;
    auVar62._28_4_ = auVar53._28_4_ + auVar14._28_4_ + fVar57;
    auVar63._0_4_ = fVar78 + auVar45._0_4_;
    auVar63._4_4_ = fVar80 + auVar45._4_4_;
    auVar63._8_4_ = fVar81 + auVar45._8_4_;
    auVar63._12_4_ = fVar82 + auVar45._12_4_;
    auVar64._16_4_ = fVar83 + fVar47;
    auVar64._0_16_ = auVar63;
    auVar64._20_4_ = fVar84 + fVar49;
    auVar64._24_4_ = fVar85 + fVar50;
    auVar64._28_4_ = auVar40._28_4_ + auVar15._28_4_ + fVar51;
    auVar58._0_4_ = fVar86 + auVar39._0_4_;
    auVar58._4_4_ = fVar89 + auVar39._4_4_;
    auVar58._8_4_ = fVar90 + auVar39._8_4_;
    auVar58._12_4_ = fVar91 + auVar39._12_4_;
    auVar59._16_4_ = fVar92 + fVar41;
    auVar59._0_16_ = auVar58;
    auVar59._20_4_ = fVar93 + fVar42;
    auVar59._24_4_ = fVar94 + fVar43;
    auVar59._28_4_ = auVar46._28_4_ + auVar88._28_4_ + fVar44;
    auVar13 = vpminsd_avx(auVar24._16_16_,auVar62._16_16_);
    auVar38 = vpminsd_avx(auVar52,auVar60);
    auVar68._16_16_ = auVar13;
    auVar68._0_16_ = auVar38;
    auVar48 = auVar25._16_16_;
    in_ZMM10 = ZEXT1664(auVar48);
    auVar13 = vpminsd_avx(auVar48,auVar64._16_16_);
    auVar38 = vpminsd_avx(auVar45,auVar63);
    auVar88._16_16_ = auVar13;
    auVar88._0_16_ = auVar38;
    auVar13 = vpminsd_avx(auVar26._16_16_,auVar59._16_16_);
    auVar38 = vpminsd_avx(auVar39,auVar58);
    auVar97._16_16_ = auVar13;
    auVar97._0_16_ = auVar38;
    auVar88 = vmaxps_avx(auVar88,auVar97);
    in_ZMM11 = ZEXT3264(auVar88);
    auVar13 = vpmaxsd_avx(auVar24._16_16_,auVar62._16_16_);
    auVar38 = vpmaxsd_avx(auVar52,auVar60);
    auVar53._16_16_ = auVar13;
    auVar53._0_16_ = auVar38;
    auVar13 = vpmaxsd_avx(auVar48,auVar64._16_16_);
    auVar38 = vpmaxsd_avx(auVar45,auVar63);
    auVar46._16_16_ = auVar13;
    auVar46._0_16_ = auVar38;
    auVar13 = vpmaxsd_avx(auVar26._16_16_,auVar59._16_16_);
    auVar38 = vpmaxsd_avx(auVar39,auVar58);
    auVar40._16_16_ = auVar13;
    auVar40._0_16_ = auVar38;
    auVar46 = vminps_avx(auVar46,auVar40);
    auVar40 = vmaxps_avx(auVar67,auVar68);
    auVar88 = vmaxps_avx(auVar40,auVar88);
    auVar40 = vminps_avx(auVar70,auVar53);
    auVar40 = vminps_avx(auVar40,auVar46);
    auVar88 = vcmpps_avx(auVar88,auVar40,2);
    auVar13 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
  }
  auVar38 = vpsllw_avx(auVar13,0xf);
  auVar13 = vpacksswb_avx(auVar38,auVar38);
  bVar16 = SUB161(auVar13 >> 7,0) & 1 | (SUB161(auVar13 >> 0xf,0) & 1) << 1 |
           (SUB161(auVar13 >> 0x17,0) & 1) << 2 | (SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
           (SUB161(auVar13 >> 0x27,0) & 1) << 4 | (SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
           (SUB161(auVar13 >> 0x37,0) & 1) << 6 | SUB161(auVar13 >> 0x3f,0) << 7;
  if ((((((((auVar38 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar38 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar38[0xf])
  goto LAB_0107aa34;
  uVar29 = uVar36 & 0xfffffffffffffff0;
  lVar12 = 0;
  if (bVar16 != 0) {
    for (; (bVar16 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  uVar36 = *(ulong *)(uVar29 + lVar12 * 8);
  uVar30 = bVar16 - 1 & (uint)bVar16;
  uVar31 = (ulong)uVar30;
  if (uVar30 != 0) {
    do {
      *puVar35 = uVar36;
      puVar35 = puVar35 + 1;
      lVar12 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      uVar36 = *(ulong *)(uVar29 + lVar12 * 8);
      uVar31 = uVar31 - 1 & uVar31;
    } while (uVar31 != 0);
  }
  goto LAB_0107aa48;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }